

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fImplementationLimitTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::CompressedTextureFormatsQueryCase::iterate
          (CompressedTextureFormatsQueryCase *this)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  deUint32 err;
  undefined4 extraout_var;
  iterator iVar4;
  char *description;
  _Rb_tree_color *p_Var5;
  long lVar6;
  size_type __n;
  vector<int,_std::allocator<int>_> formats;
  set<int,_std::less<int>,_std::allocator<int>_> formatSet;
  GLint val;
  _Vector_base<int,_std::allocator<int>_> local_208;
  Enum<int,_2UL> local_1f0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1e0;
  undefined1 local_1b0 [384];
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  local_1b0._0_4_ = 0xffffffff;
  (**(code **)(lVar6 + 0x868))(0x86a2,local_1b0);
  __n = (size_type)(int)local_1b0._0_4_;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_208,__n,(allocator_type *)local_1b0);
  if (0 < (long)__n) {
    (**(code **)(lVar6 + 0x868))(0x86a3,local_208._M_impl.super__Vector_impl_data._M_start);
  }
  err = (**(code **)(lVar6 + 0x800))();
  glu::checkError(err,"Query failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fImplementationLimitTests.cpp"
                  ,0x128);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Reported:");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  poVar1 = (ostringstream *)(local_1b0 + 8);
  for (p_Var5 = (_Rb_tree_color *)local_208._M_impl.super__Vector_impl_data._M_start;
      p_Var5 != (_Rb_tree_color *)local_208._M_impl.super__Vector_impl_data._M_finish;
      p_Var5 = p_Var5 + 1) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    local_1e0._M_impl.super__Rb_tree_header._M_header._M_color = *p_Var5;
    local_1e0._M_impl._0_8_ = glu::getCompressedTextureFormatName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&local_1e0,(ostream *)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  std::set<int,std::less<int>,std::allocator<int>>::
  set<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((set<int,std::less<int>,std::allocator<int>> *)&local_1e0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_208._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_208._M_impl.super__Vector_impl_data._M_finish);
  bVar2 = true;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  for (lVar6 = 0; lVar6 != 0x28; lVar6 = lVar6 + 4) {
    iVar3 = *(int *)((long)&s_requiredCompressedTexFormats + lVar6);
    local_1b0._0_4_ = iVar3;
    iVar4 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                      (&local_1e0,(key_type_conflict *)local_1b0);
    if ((_Rb_tree_header *)iVar4._M_node == &local_1e0._M_impl.super__Rb_tree_header) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"ERROR: ");
      local_1f0.m_getName = glu::getCompressedTextureFormatName;
      local_1f0.m_value = iVar3;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1f0,(ostream *)poVar1);
      std::operator<<((ostream *)poVar1," is missing!");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      bVar2 = false;
    }
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1e0);
  description = "Requirement not satisfied";
  if (bVar2) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~bVar2 & QP_TEST_RESULT_FAIL,description);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_208);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
		const GLint				numFormats		= query<GLint>(gl, GL_NUM_COMPRESSED_TEXTURE_FORMATS);
		vector<GLint>			formats			(numFormats);
		bool					allFormatsOk	= true;

		if (numFormats > 0)
			gl.getIntegerv(GL_COMPRESSED_TEXTURE_FORMATS, &formats[0]);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Query failed");

		// Log formats.
		m_testCtx.getLog() << TestLog::Message << "Reported:" << TestLog::EndMessage;
		for (vector<GLint>::const_iterator fmt = formats.begin(); fmt != formats.end(); fmt++)
			m_testCtx.getLog() << TestLog::Message << glu::getCompressedTextureFormatStr(*fmt) << TestLog::EndMessage;

		// Check that all required formats are in list.
		{
			set<GLint> formatSet(formats.begin(), formats.end());

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_requiredCompressedTexFormats); ndx++)
			{
				const deUint32	fmt		= s_requiredCompressedTexFormats[ndx];
				const bool		found	= formatSet.find(fmt) != formatSet.end();

				if (!found)
				{
					m_testCtx.getLog() << TestLog::Message << "ERROR: " << glu::getCompressedTextureFormatStr(fmt) << " is missing!" << TestLog::EndMessage;
					allFormatsOk = false;
				}
			}
		}

		m_testCtx.setTestResult(allFormatsOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								allFormatsOk ? "Pass"				: "Requirement not satisfied");
		return STOP;
	}